

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

char * __thiscall
google::protobuf::FileOptions::_InternalParse(FileOptions *this,char *ptr,ParseContext *ctx)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  Rep *pRVar5;
  uint uVar6;
  pair<const_char_*,_unsigned_long> pVar7;
  UninterpretedOption *msg;
  char cVar8;
  uint32 uVar9;
  uint tag;
  unsigned_long extraout_RDX;
  unsigned_long extraout_RDX_00;
  Arena *arena;
  uint uVar10;
  char cVar11;
  ArenaStringPtr *this_00;
  pair<const_char_*,_unsigned_int> pVar12;
  pair<const_char_*,_unsigned_long> pVar13;
  pair<const_char_*,_unsigned_long> pVar14;
  pair<const_char_*,_bool> pVar15;
  
  uVar10 = 0;
  do {
    if (ptr < (ctx->super_EpsCopyInputStream).limit_end_) {
      pVar15._8_8_ = 0;
      pVar15.first = ptr;
    }
    else {
      pVar15._8_8_ = 1;
      pVar15.first = ptr;
      if ((long)ptr - (long)(ctx->super_EpsCopyInputStream).buffer_end_ !=
          (long)(ctx->super_EpsCopyInputStream).limit_) {
        pVar15 = internal::EpsCopyInputStream::DoneFallback
                           (&ctx->super_EpsCopyInputStream,ptr,ctx->group_depth_);
      }
    }
    ptr = pVar15.first;
    if (((undefined1  [16])pVar15 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
    goto LAB_002eeddb;
    bVar2 = *ptr;
    pVar12.second._0_1_ = bVar2;
    pVar12.first = (char *)((byte *)ptr + 1);
    pVar12._9_7_ = 0;
    if ((char)bVar2 < '\0') {
      bVar3 = ((byte *)ptr)[1];
      uVar9 = ((uint)bVar2 + (uint)bVar3 * 0x80) - 0x80;
      if ((char)bVar3 < '\0') {
        pVar12 = internal::ReadTagFallback(ptr,uVar9);
      }
      else {
        pVar12.second = uVar9;
        pVar12.first = (char *)((byte *)ptr + 2);
        pVar12._12_4_ = 0;
      }
    }
    ptr = pVar12.first;
    cVar11 = '\x04';
    if ((byte *)ptr != (byte *)0x0) {
      tag = pVar12.second;
      uVar6 = (uint)(pVar12._8_8_ >> 3) & 0x1fffffff;
      cVar8 = (char)pVar12.second;
      switch(uVar6) {
      case 1:
        if (cVar8 != '\n') break;
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
        arena = (Arena *)(this->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         .ptr_;
        this_00 = &this->java_package_;
        if (((ulong)arena & 1) != 0) {
          arena = *(Arena **)(((ulong)arena & 0xfffffffffffffffe) + 0x18);
        }
LAB_002eeab8:
        if (this_00->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstance
                    (this_00,arena,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        }
        ptr = internal::InlineGreedyStringParser(this_00->ptr_,ptr,ctx);
        goto LAB_002eeae1;
      case 2:
      case 3:
      case 4:
      case 5:
      case 6:
      case 7:
      case 0xc:
      case 0xd:
      case 0xe:
      case 0xf:
      case 0x13:
      case 0x15:
      case 0x16:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1c:
      case 0x1d:
      case 0x1e:
      case 0x20:
      case 0x21:
      case 0x22:
      case 0x23:
      case 0x26:
      case 0x2b:
        break;
      case 8:
        if (cVar8 == 'B') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
          arena = (Arena *)(this->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                           .ptr_;
          this_00 = &this->java_outer_classname_;
          if (((ulong)arena & 1) != 0) {
            arena = *(Arena **)(((ulong)arena & 0xfffffffffffffffe) + 0x18);
          }
          goto LAB_002eeab8;
        }
        break;
      case 9:
        if (cVar8 == 'H') {
          bVar2 = *ptr;
          pVar13.second = (long)(char)bVar2;
          pVar13.first = (char *)((byte *)ptr + 1);
          if ((long)(char)bVar2 < 0) {
            bVar3 = ((byte *)ptr)[1];
            uVar9 = ((uint)bVar2 + (uint)bVar3 * 0x80) - 0x80;
            if ((char)bVar3 < '\0') {
              pVar13 = internal::VarintParseSlow64(ptr,uVar9);
            }
            else {
              pVar13.second._0_4_ = uVar9;
              pVar13.first = (char *)((byte *)ptr + 2);
              pVar13.second._4_4_ = 0;
            }
          }
          ptr = pVar13.first;
          if ((byte *)ptr != (byte *)0x0) {
            if ((int)pVar13.second - 1U < 3) {
              pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 2);
              *pbVar1 = *pbVar1 | 8;
              this->optimize_for_ = (int)pVar13.second;
            }
            else {
              _InternalParse();
              pVar13.second = extraout_RDX_00;
              pVar13.first = ptr;
            }
            goto LAB_002eebc5;
          }
          goto LAB_002eed03;
        }
        break;
      case 10:
        if (cVar8 == 'P') {
          bVar2 = *ptr;
          pVar14.second = (long)(char)bVar2;
          pVar14.first = (char *)((byte *)ptr + 1);
          if ((long)(char)bVar2 < 0) {
            bVar3 = ((byte *)ptr)[1];
            uVar9 = ((uint)bVar2 + (uint)bVar3 * 0x80) - 0x80;
            if ((char)bVar3 < '\0') {
              pVar14 = internal::VarintParseSlow64(ptr,uVar9);
            }
            else {
              pVar14.second._0_4_ = uVar9;
              pVar14.first = (char *)((byte *)ptr + 2);
              pVar14.second._4_4_ = 0;
            }
          }
          uVar10 = uVar10 | 0x400;
          this->java_multiple_files_ = pVar14.second != 0;
LAB_002eecf0:
          ptr = pVar14.first;
          cVar11 = ((byte *)ptr == (byte *)0x0) * '\x02' + '\x02';
          goto LAB_002eed03;
        }
        break;
      case 0xb:
        if (cVar8 == 'Z') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
          arena = (Arena *)(this->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                           .ptr_;
          this_00 = &this->go_package_;
          if (((ulong)arena & 1) != 0) {
            arena = *(Arena **)(((ulong)arena & 0xfffffffffffffffe) + 0x18);
          }
          goto LAB_002eeab8;
        }
        break;
      case 0x10:
        break;
      case 0x11:
        if (cVar8 == -0x78) {
          bVar2 = *ptr;
          pVar14.second = (long)(char)bVar2;
          pVar14.first = (char *)((byte *)ptr + 1);
          if ((long)(char)bVar2 < 0) {
            bVar3 = ((byte *)ptr)[1];
            uVar9 = ((uint)bVar2 + (uint)bVar3 * 0x80) - 0x80;
            if ((char)bVar3 < '\0') {
              pVar14 = internal::VarintParseSlow64(ptr,uVar9);
            }
            else {
              pVar14.second._0_4_ = uVar9;
              pVar14.first = (char *)((byte *)ptr + 2);
              pVar14.second._4_4_ = 0;
            }
          }
          uVar10 = uVar10 | 0x4000;
          this->java_generic_services_ = pVar14.second != 0;
          goto LAB_002eecf0;
        }
        break;
      case 0x12:
        if (cVar8 == -0x70) {
          bVar2 = *ptr;
          pVar14.second = (long)(char)bVar2;
          pVar14.first = (char *)((byte *)ptr + 1);
          if ((long)(char)bVar2 < 0) {
            bVar3 = ((byte *)ptr)[1];
            uVar9 = ((uint)bVar2 + (uint)bVar3 * 0x80) - 0x80;
            if ((char)bVar3 < '\0') {
              pVar14 = internal::VarintParseSlow64(ptr,uVar9);
            }
            else {
              pVar14.second._0_4_ = uVar9;
              pVar14.first = (char *)((byte *)ptr + 2);
              pVar14.second._4_4_ = 0;
            }
          }
          uVar10 = uVar10 | 0x8000;
          this->py_generic_services_ = pVar14.second != 0;
          goto LAB_002eecf0;
        }
        break;
      case 0x14:
        if (cVar8 == -0x60) {
          bVar2 = *ptr;
          pVar14.second = (long)(char)bVar2;
          pVar14.first = (char *)((byte *)ptr + 1);
          if ((long)(char)bVar2 < 0) {
            bVar3 = ((byte *)ptr)[1];
            uVar9 = ((uint)bVar2 + (uint)bVar3 * 0x80) - 0x80;
            if ((char)bVar3 < '\0') {
              pVar14 = internal::VarintParseSlow64(ptr,uVar9);
            }
            else {
              pVar14.second._0_4_ = uVar9;
              pVar14.first = (char *)((byte *)ptr + 2);
              pVar14.second._4_4_ = 0;
            }
          }
          uVar10 = uVar10 | 0x800;
          this->java_generate_equals_and_hash_ = pVar14.second != 0;
          goto LAB_002eecf0;
        }
        break;
      case 0x17:
        if (cVar8 == -0x48) {
          bVar2 = *ptr;
          pVar14.second = (long)(char)bVar2;
          pVar14.first = (char *)((byte *)ptr + 1);
          if ((long)(char)bVar2 < 0) {
            bVar3 = ((byte *)ptr)[1];
            uVar9 = ((uint)bVar2 + (uint)bVar3 * 0x80) - 0x80;
            if ((char)bVar3 < '\0') {
              pVar14 = internal::VarintParseSlow64(ptr,uVar9);
            }
            else {
              pVar14.second._0_4_ = uVar9;
              pVar14.first = (char *)((byte *)ptr + 2);
              pVar14.second._4_4_ = 0;
            }
          }
          uVar10 = uVar10 | 0x20000;
          this->deprecated_ = pVar14.second != 0;
          goto LAB_002eecf0;
        }
        break;
      case 0x1b:
        if (cVar8 == -0x28) {
          bVar2 = *ptr;
          pVar14.second = (long)(char)bVar2;
          pVar14.first = (char *)((byte *)ptr + 1);
          if ((long)(char)bVar2 < 0) {
            bVar3 = ((byte *)ptr)[1];
            uVar9 = ((uint)bVar2 + (uint)bVar3 * 0x80) - 0x80;
            if ((char)bVar3 < '\0') {
              pVar14 = internal::VarintParseSlow64(ptr,uVar9);
            }
            else {
              pVar14.second._0_4_ = uVar9;
              pVar14.first = (char *)((byte *)ptr + 2);
              pVar14.second._4_4_ = 0;
            }
          }
          uVar10 = uVar10 | 0x1000;
          this->java_string_check_utf8_ = pVar14.second != 0;
          goto LAB_002eecf0;
        }
        break;
      case 0x1f:
        if (cVar8 == -8) {
          bVar2 = *ptr;
          pVar14.second = (long)(char)bVar2;
          pVar14.first = (char *)((byte *)ptr + 1);
          if ((long)(char)bVar2 < 0) {
            bVar3 = ((byte *)ptr)[1];
            uVar9 = ((uint)bVar2 + (uint)bVar3 * 0x80) - 0x80;
            if ((char)bVar3 < '\0') {
              pVar14 = internal::VarintParseSlow64(ptr,uVar9);
            }
            else {
              pVar14.second._0_4_ = uVar9;
              pVar14.first = (char *)((byte *)ptr + 2);
              pVar14.second._4_4_ = 0;
            }
          }
          uVar10 = uVar10 | 0x40000;
          this->cc_enable_arenas_ = pVar14.second != 0;
          goto LAB_002eecf0;
        }
        break;
      case 0x24:
        if (cVar8 == '\"') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
          arena = (Arena *)(this->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                           .ptr_;
          this_00 = &this->objc_class_prefix_;
          if (((ulong)arena & 1) != 0) {
            arena = *(Arena **)(((ulong)arena & 0xfffffffffffffffe) + 0x18);
          }
          goto LAB_002eeab8;
        }
        break;
      case 0x25:
        if (cVar8 == '*') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x10;
          arena = (Arena *)(this->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                           .ptr_;
          this_00 = &this->csharp_namespace_;
          if (((ulong)arena & 1) != 0) {
            arena = *(Arena **)(((ulong)arena & 0xfffffffffffffffe) + 0x18);
          }
          goto LAB_002eeab8;
        }
        break;
      case 0x27:
        if (cVar8 == ':') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x20;
          arena = (Arena *)(this->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                           .ptr_;
          this_00 = &this->swift_prefix_;
          if (((ulong)arena & 1) != 0) {
            arena = *(Arena **)(((ulong)arena & 0xfffffffffffffffe) + 0x18);
          }
          goto LAB_002eeab8;
        }
        break;
      case 0x28:
        if (cVar8 == 'B') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x40;
          arena = (Arena *)(this->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                           .ptr_;
          this_00 = &this->php_class_prefix_;
          if (((ulong)arena & 1) != 0) {
            arena = *(Arena **)(((ulong)arena & 0xfffffffffffffffe) + 0x18);
          }
          goto LAB_002eeab8;
        }
        break;
      case 0x29:
        if (cVar8 == 'J') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x80;
          arena = (Arena *)(this->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                           .ptr_;
          this_00 = &this->php_namespace_;
          if (((ulong)arena & 1) != 0) {
            arena = *(Arena **)(((ulong)arena & 0xfffffffffffffffe) + 0x18);
          }
          goto LAB_002eeab8;
        }
        break;
      case 0x2a:
        if (cVar8 == 'P') {
          bVar2 = *ptr;
          pVar14.second = (long)(char)bVar2;
          pVar14.first = (char *)((byte *)ptr + 1);
          if ((long)(char)bVar2 < 0) {
            bVar3 = ((byte *)ptr)[1];
            uVar9 = ((uint)bVar2 + (uint)bVar3 * 0x80) - 0x80;
            if ((char)bVar3 < '\0') {
              pVar14 = internal::VarintParseSlow64(ptr,uVar9);
            }
            else {
              pVar14.second._0_4_ = uVar9;
              pVar14.first = (char *)((byte *)ptr + 2);
              pVar14.second._4_4_ = 0;
            }
          }
          uVar10 = uVar10 | 0x10000;
          this->php_generic_services_ = pVar14.second != 0;
          goto LAB_002eecf0;
        }
        break;
      case 0x2c:
        if (cVar8 == 'b') {
          pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
          *pbVar1 = *pbVar1 | 1;
          arena = (Arena *)(this->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                           .ptr_;
          this_00 = &this->php_metadata_namespace_;
          if (((ulong)arena & 1) != 0) {
            arena = *(Arena **)(((ulong)arena & 0xfffffffffffffffe) + 0x18);
          }
          goto LAB_002eeab8;
        }
        break;
      case 0x2d:
        if (cVar8 == 'j') {
          pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
          *pbVar1 = *pbVar1 | 2;
          arena = (Arena *)(this->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                           .ptr_;
          this_00 = &this->ruby_package_;
          if (((ulong)arena & 1) != 0) {
            arena = *(Arena **)(((ulong)arena & 0xfffffffffffffffe) + 0x18);
          }
          goto LAB_002eeab8;
        }
        break;
      default:
        if ((uVar6 == 999) && (cVar8 == ':')) {
          ptr = (char *)((byte *)ptr + -2);
          do {
            pRVar5 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
            if (pRVar5 == (Rep *)0x0) {
LAB_002ee6a7:
              internal::RepeatedPtrFieldBase::Reserve
                        (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,
                         (this->uninterpreted_option_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_002ee6b6:
              pRVar5 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
              pRVar5->allocated_size = pRVar5->allocated_size + 1;
              msg = Arena::CreateMaybeMessage<google::protobuf::UninterpretedOption>
                              ((this->uninterpreted_option_).super_RepeatedPtrFieldBase.arena_);
              pRVar5 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
              iVar4 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
              (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = iVar4 + 1;
              pRVar5->elements[iVar4] = msg;
            }
            else {
              iVar4 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
              if (pRVar5->allocated_size <= iVar4) {
                if (pRVar5->allocated_size ==
                    (this->uninterpreted_option_).super_RepeatedPtrFieldBase.total_size_)
                goto LAB_002ee6a7;
                goto LAB_002ee6b6;
              }
              (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = iVar4 + 1;
              msg = (UninterpretedOption *)pRVar5->elements[iVar4];
            }
            ptr = internal::ParseContext::ParseMessage<google::protobuf::UninterpretedOption>
                            (ctx,msg,(char *)((byte *)ptr + 2));
            pVar13.second = extraout_RDX;
            pVar13.first = ptr;
            pVar7.second = extraout_RDX;
            pVar7.first = ptr;
            if ((byte *)ptr == (byte *)0x0) goto LAB_002eed03;
          } while ((ptr < (ctx->super_EpsCopyInputStream).limit_end_) &&
                  (pVar13 = pVar7, *(short *)ptr == 0x3eba));
LAB_002eebc5:
          ptr = pVar13.first;
          cVar11 = '\x02';
          goto LAB_002eed03;
        }
      }
      if (tag == 0 || (tag & 7) == 4) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = tag - 1;
        cVar11 = '\t';
      }
      else {
        if (tag < 8000) {
          ptr = internal::UnknownFieldParse(tag,&this->_internal_metadata_,ptr,ctx);
        }
        else {
          ptr = internal::ExtensionSet::ParseField
                          (&this->_extensions_,pVar12._8_8_ & 0xffffffff,ptr,
                           (Message *)_FileOptions_default_instance_,&this->_internal_metadata_,ctx)
          ;
        }
LAB_002eeae1:
        cVar11 = ((byte *)ptr == (byte *)0x0) * '\x02' + '\x02';
      }
    }
LAB_002eed03:
  } while (cVar11 == '\x02');
  if (cVar11 == '\x04') {
    ptr = (char *)0x0;
  }
LAB_002eeddb:
  (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar10;
  return (char *)(byte *)ptr;
}

Assistant:

const char* FileOptions::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string java_package = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_java_package(), ptr, ctx, "google.protobuf.FileOptions.java_package");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string java_outer_classname = 8;
      case 8:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 66)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_java_outer_classname(), ptr, ctx, "google.protobuf.FileOptions.java_outer_classname");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.FileOptions.OptimizeMode optimize_for = 9 [default = SPEED];
      case 9:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 72)) {
          ::PROTOBUF_NAMESPACE_ID::uint64 val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
          if (PROTOBUF_PREDICT_TRUE(PROTOBUF_NAMESPACE_ID::FileOptions_OptimizeMode_IsValid(val))) {
            _internal_set_optimize_for(static_cast<PROTOBUF_NAMESPACE_ID::FileOptions_OptimizeMode>(val));
          } else {
            ::PROTOBUF_NAMESPACE_ID::internal::WriteVarint(9, val, mutable_unknown_fields());
          }
        } else goto handle_unusual;
        continue;
      // optional bool java_multiple_files = 10 [default = false];
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 80)) {
          _Internal::set_has_java_multiple_files(&has_bits);
          java_multiple_files_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string go_package = 11;
      case 11:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 90)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_go_package(), ptr, ctx, "google.protobuf.FileOptions.go_package");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool cc_generic_services = 16 [default = false];
      case 16:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 128)) {
          _Internal::set_has_cc_generic_services(&has_bits);
          cc_generic_services_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool java_generic_services = 17 [default = false];
      case 17:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 136)) {
          _Internal::set_has_java_generic_services(&has_bits);
          java_generic_services_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool py_generic_services = 18 [default = false];
      case 18:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 144)) {
          _Internal::set_has_py_generic_services(&has_bits);
          py_generic_services_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool java_generate_equals_and_hash = 20 [deprecated = true];
      case 20:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 160)) {
          _Internal::set_has_java_generate_equals_and_hash(&has_bits);
          java_generate_equals_and_hash_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool deprecated = 23 [default = false];
      case 23:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 184)) {
          _Internal::set_has_deprecated(&has_bits);
          deprecated_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool java_string_check_utf8 = 27 [default = false];
      case 27:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 216)) {
          _Internal::set_has_java_string_check_utf8(&has_bits);
          java_string_check_utf8_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool cc_enable_arenas = 31 [default = false];
      case 31:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 248)) {
          _Internal::set_has_cc_enable_arenas(&has_bits);
          cc_enable_arenas_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string objc_class_prefix = 36;
      case 36:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 34)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_objc_class_prefix(), ptr, ctx, "google.protobuf.FileOptions.objc_class_prefix");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string csharp_namespace = 37;
      case 37:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 42)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_csharp_namespace(), ptr, ctx, "google.protobuf.FileOptions.csharp_namespace");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string swift_prefix = 39;
      case 39:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 58)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_swift_prefix(), ptr, ctx, "google.protobuf.FileOptions.swift_prefix");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string php_class_prefix = 40;
      case 40:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 66)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_php_class_prefix(), ptr, ctx, "google.protobuf.FileOptions.php_class_prefix");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string php_namespace = 41;
      case 41:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 74)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_php_namespace(), ptr, ctx, "google.protobuf.FileOptions.php_namespace");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool php_generic_services = 42 [default = false];
      case 42:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 80)) {
          _Internal::set_has_php_generic_services(&has_bits);
          php_generic_services_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string php_metadata_namespace = 44;
      case 44:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 98)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_php_metadata_namespace(), ptr, ctx, "google.protobuf.FileOptions.php_metadata_namespace");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string ruby_package = 45;
      case 45:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 106)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_ruby_package(), ptr, ctx, "google.protobuf.FileOptions.ruby_package");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 58)) {
          ptr -= 2;
          do {
            ptr += 2;
            ptr = ctx->ParseMessage(_internal_add_uninterpreted_option(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<7994>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
      if ((8000u <= tag)) {
        ptr = _extensions_.ParseField(tag, ptr,
            internal_default_instance(), &_internal_metadata_, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}